

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_3e90a3a::BIP32PubkeyProvider::GetExtKey
          (BIP32PubkeyProvider *this,SigningProvider *arg,CExtKey *ret)

{
  ChainCode *pCVar1;
  base_blob<256U> *pbVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined1 uVar16;
  undefined1 uVar17;
  undefined1 uVar18;
  undefined1 uVar19;
  undefined1 uVar20;
  undefined1 uVar21;
  undefined1 uVar22;
  undefined1 uVar23;
  undefined1 uVar24;
  undefined1 uVar25;
  undefined1 uVar26;
  undefined1 uVar27;
  undefined1 uVar28;
  undefined1 uVar29;
  undefined1 uVar30;
  undefined1 uVar31;
  undefined1 uVar32;
  undefined1 uVar33;
  int iVar34;
  long in_FS_OFFSET;
  CKey key;
  CKey local_58;
  CKeyID local_44;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.fCompressed = false;
  local_58.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )(__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
          )0x0;
  CPubKey::GetID(&local_44,(CPubKey *)&this->field_0x3c);
  iVar34 = (*arg->_vptr_SigningProvider[5])(arg,&local_44,&local_58);
  if (SUB41(iVar34,0) != false) {
    ret->nDepth = this->field_0x10;
    uVar3 = this->field_0x12;
    uVar4 = this->field_0x13;
    uVar5 = this->field_0x14;
    ret->vchFingerprint[0] = this->field_0x11;
    ret->vchFingerprint[1] = uVar3;
    ret->vchFingerprint[2] = uVar4;
    ret->vchFingerprint[3] = uVar5;
    ret->nChild = *(uint *)&this->field_0x18;
    uVar3 = this->field_0x1d;
    uVar4 = this->field_0x1e;
    uVar5 = this->field_0x1f;
    uVar6 = this->field_0x20;
    uVar7 = this->field_0x21;
    uVar8 = this->field_0x22;
    uVar9 = this->field_0x23;
    uVar10 = this->field_0x24;
    uVar11 = this->field_0x25;
    uVar12 = this->field_0x26;
    uVar13 = this->field_0x27;
    uVar14 = this->field_0x28;
    uVar15 = this->field_0x29;
    uVar16 = this->field_0x2a;
    uVar17 = this->field_0x2b;
    uVar18 = this->field_0x2c;
    uVar19 = this->field_0x2d;
    uVar20 = this->field_0x2e;
    uVar21 = this->field_0x2f;
    uVar22 = this->field_0x30;
    uVar23 = this->field_0x31;
    uVar24 = this->field_0x32;
    uVar25 = this->field_0x33;
    uVar26 = this->field_0x34;
    uVar27 = this->field_0x35;
    uVar28 = this->field_0x36;
    uVar29 = this->field_0x37;
    uVar30 = this->field_0x38;
    uVar31 = this->field_0x39;
    uVar32 = this->field_0x3a;
    uVar33 = this->field_0x3b;
    pCVar1 = &ret->chaincode;
    (pCVar1->super_base_blob<256U>).m_data._M_elems[0] = this->field_0x1c;
    (pCVar1->super_base_blob<256U>).m_data._M_elems[1] = uVar3;
    (pCVar1->super_base_blob<256U>).m_data._M_elems[2] = uVar4;
    (pCVar1->super_base_blob<256U>).m_data._M_elems[3] = uVar5;
    (pCVar1->super_base_blob<256U>).m_data._M_elems[4] = uVar6;
    (pCVar1->super_base_blob<256U>).m_data._M_elems[5] = uVar7;
    (pCVar1->super_base_blob<256U>).m_data._M_elems[6] = uVar8;
    (pCVar1->super_base_blob<256U>).m_data._M_elems[7] = uVar9;
    pbVar2 = &(ret->chaincode).super_base_blob<256U>;
    (pbVar2->m_data)._M_elems[8] = uVar10;
    (pbVar2->m_data)._M_elems[9] = uVar11;
    (pbVar2->m_data)._M_elems[10] = uVar12;
    (pbVar2->m_data)._M_elems[0xb] = uVar13;
    (pbVar2->m_data)._M_elems[0xc] = uVar14;
    (pbVar2->m_data)._M_elems[0xd] = uVar15;
    (pbVar2->m_data)._M_elems[0xe] = uVar16;
    (pbVar2->m_data)._M_elems[0xf] = uVar17;
    pbVar2 = &(ret->chaincode).super_base_blob<256U>;
    (pbVar2->m_data)._M_elems[0x10] = uVar18;
    (pbVar2->m_data)._M_elems[0x11] = uVar19;
    (pbVar2->m_data)._M_elems[0x12] = uVar20;
    (pbVar2->m_data)._M_elems[0x13] = uVar21;
    (pbVar2->m_data)._M_elems[0x14] = uVar22;
    (pbVar2->m_data)._M_elems[0x15] = uVar23;
    (pbVar2->m_data)._M_elems[0x16] = uVar24;
    (pbVar2->m_data)._M_elems[0x17] = uVar25;
    pbVar2 = &(ret->chaincode).super_base_blob<256U>;
    (pbVar2->m_data)._M_elems[0x18] = uVar26;
    (pbVar2->m_data)._M_elems[0x19] = uVar27;
    (pbVar2->m_data)._M_elems[0x1a] = uVar28;
    (pbVar2->m_data)._M_elems[0x1b] = uVar29;
    (pbVar2->m_data)._M_elems[0x1c] = uVar30;
    (pbVar2->m_data)._M_elems[0x1d] = uVar31;
    (pbVar2->m_data)._M_elems[0x1e] = uVar32;
    (pbVar2->m_data)._M_elems[0x1f] = uVar33;
    CKey::operator=(&ret->key,&local_58);
  }
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&local_58.keydata);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return SUB41(iVar34,0);
  }
  __stack_chk_fail();
}

Assistant:

bool GetExtKey(const SigningProvider& arg, CExtKey& ret) const
    {
        CKey key;
        if (!arg.GetKey(m_root_extkey.pubkey.GetID(), key)) return false;
        ret.nDepth = m_root_extkey.nDepth;
        std::copy(m_root_extkey.vchFingerprint, m_root_extkey.vchFingerprint + sizeof(ret.vchFingerprint), ret.vchFingerprint);
        ret.nChild = m_root_extkey.nChild;
        ret.chaincode = m_root_extkey.chaincode;
        ret.key = key;
        return true;
    }